

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertyScanTable
              (Scl_Tree_t *p,Vec_Ptr_t *vOut,Scl_Item_t *pTiming,char *pName,Vec_Ptr_t *vTemples)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Scl_Item_t *pSVar5;
  Vec_Int_t *pVVar6;
  char *__s2;
  void *pvVar7;
  Vec_Flt_t *pVVar8;
  Vec_Flt_t *pVVar9;
  float Entry_00;
  Vec_Flt_t *local_100;
  Vec_Flt_t *local_f8;
  Vec_Flt_t *local_d0;
  Vec_Flt_t *local_c8;
  int y;
  int x;
  Vec_Flt_t *vValues2;
  float local_88;
  float Entry;
  int i;
  int iPlace;
  char *pTempl;
  char *pThis;
  Scl_Item_t *pTable;
  Scl_Item_t *pItem;
  Vec_Flt_t *vInd2;
  Vec_Flt_t *vInd1;
  Vec_Flt_t *vValues;
  Vec_Flt_t *vIndex2;
  Vec_Flt_t *vIndex1;
  Vec_Ptr_t *vTemples_local;
  char *pName_local;
  Scl_Item_t *pTiming_local;
  Vec_Ptr_t *vOut_local;
  Scl_Tree_t *p_local;
  
  vIndex2 = (Vec_Flt_t *)0x0;
  vValues = (Vec_Flt_t *)0x0;
  vInd1 = (Vec_Flt_t *)0x0;
  vIndex1 = (Vec_Flt_t *)vTemples;
  vTemples_local = (Vec_Ptr_t *)pName;
  pName_local = (char *)pTiming;
  pTiming_local = (Scl_Item_t *)vOut;
  vOut_local = (Vec_Ptr_t *)p;
  pThis = (char *)Scl_LibertyItem(p,pTiming->Child);
  while ((pThis != (char *)0x0 &&
         (iVar1 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,*(Scl_Pair_t *)(pThis + 8),
                                     (char *)vTemples_local), iVar1 != 0))) {
    pThis = (char *)Scl_LibertyItem((Scl_Tree_t *)vOut_local,*(int *)(pThis + 0x20));
  }
  if (pThis == (char *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    pcVar4 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,*(Scl_Pair_t *)(pThis + 0x10));
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
      for (pTable = Scl_LibertyItem((Scl_Tree_t *)vOut_local,*(int *)(pThis + 0x24));
          pVVar8 = vValues, pTable != (Scl_Item_t *)0x0;
          pTable = Scl_LibertyItem((Scl_Tree_t *)vOut_local,pTable->Next)) {
        iVar1 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,pTable->Key,"index_1");
        if (iVar1 == 0) {
          if (vIndex2 != (Vec_Flt_t *)0x0) {
            __assert_fail("vIndex1 == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                          ,0x40f,
                          "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          pcVar4 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,pTable->Head);
          vIndex2 = Scl_LibertyReadFloatVec(pcVar4);
        }
        else {
          iVar1 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,pTable->Key,"index_2");
          if (iVar1 == 0) {
            if (vValues != (Vec_Flt_t *)0x0) {
              __assert_fail("vIndex2 == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                            ,0x411,
                            "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
            pcVar4 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,pTable->Head);
            vValues = Scl_LibertyReadFloatVec(pcVar4);
          }
          else {
            iVar1 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,pTable->Key,"values");
            if (iVar1 == 0) {
              if (vInd1 != (Vec_Flt_t *)0x0) {
                __assert_fail("vValues == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                              ,0x413,
                              "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pcVar4 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,pTable->Head);
              vInd1 = Scl_LibertyReadFloatVec(pcVar4);
            }
          }
        }
      }
      if (((vIndex2 == (Vec_Flt_t *)0x0) || (vValues == (Vec_Flt_t *)0x0)) ||
         (vInd1 == (Vec_Flt_t *)0x0)) {
        printf("Incomplete table specification\n");
        return 0;
      }
      Vec_PtrPush((Vec_Ptr_t *)pTiming_local,vIndex2);
      Vec_PtrPush((Vec_Ptr_t *)pTiming_local,pVVar8);
      Vec_PtrPush((Vec_Ptr_t *)pTiming_local,vInd1);
    }
    else {
      iVar1 = strcmp(pcVar4,"scalar");
      if (iVar1 == 0) {
        pSVar5 = Scl_LibertyItem((Scl_Tree_t *)vOut_local,*(int *)(pThis + 0x24));
        if (pSVar5 != (Scl_Item_t *)0x0) {
          iVar1 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,pSVar5->Key,"values");
          if (iVar1 != 0) {
            printf("Cannot read \"scalar\" template\n");
            return 0;
          }
          if (vInd1 != (Vec_Flt_t *)0x0) {
            __assert_fail("vValues == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                          ,0x424,
                          "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          pcVar4 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,pSVar5->Head);
          vInd1 = Scl_LibertyReadFloatVec(pcVar4);
          iVar1 = Vec_FltSize(vInd1);
          pSVar5 = pTiming_local;
          if (iVar1 != 1) {
            __assert_fail("Vec_FltSize(vValues) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                          ,0x426,
                          "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          pVVar6 = Vec_IntStart(1);
          Vec_PtrPush((Vec_Ptr_t *)pSVar5,pVVar6);
          pSVar5 = pTiming_local;
          pVVar6 = Vec_IntStart(1);
          Vec_PtrPush((Vec_Ptr_t *)pSVar5,pVVar6);
          Vec_PtrPush((Vec_Ptr_t *)pTiming_local,vInd1);
        }
      }
      else {
        Entry = -NAN;
        for (local_88 = 0.0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)vIndex1), (int)local_88 < iVar1;
            local_88 = (float)((int)local_88 + 1)) {
          __s2 = (char *)Vec_PtrEntry((Vec_Ptr_t *)vIndex1,(int)local_88);
          if (((int)local_88 % 4 == 0) && (iVar1 = strcmp(pcVar4,__s2), iVar1 == 0)) {
            Entry = local_88;
            break;
          }
        }
        if (Entry == -NAN) {
          printf("Template cannot be found in the template library\n");
          return 0;
        }
        for (pTable = Scl_LibertyItem((Scl_Tree_t *)vOut_local,*(int *)(pThis + 0x24));
            pTable != (Scl_Item_t *)0x0;
            pTable = Scl_LibertyItem((Scl_Tree_t *)vOut_local,pTable->Next)) {
          iVar1 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,pTable->Key,"index_1");
          if (iVar1 == 0) {
            if (vIndex2 != (Vec_Flt_t *)0x0) {
              __assert_fail("vIndex1 == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                            ,0x440,
                            "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
            pcVar4 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,pTable->Head);
            vIndex2 = Scl_LibertyReadFloatVec(pcVar4);
          }
          else {
            iVar1 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,pTable->Key,"index_2");
            if (iVar1 == 0) {
              if (vValues != (Vec_Flt_t *)0x0) {
                __assert_fail("vIndex2 == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                              ,0x442,
                              "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pcVar4 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,pTable->Head);
              vValues = Scl_LibertyReadFloatVec(pcVar4);
            }
            else {
              iVar1 = Scl_LibertyCompare((Scl_Tree_t *)vOut_local,pTable->Key,"values");
              if (iVar1 == 0) {
                if (vInd1 != (Vec_Flt_t *)0x0) {
                  __assert_fail("vValues == NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                                ,0x444,
                                "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                               );
                }
                pcVar4 = Scl_LibertyReadString((Scl_Tree_t *)vOut_local,pTable->Head);
                vInd1 = Scl_LibertyReadFloatVec(pcVar4);
              }
            }
          }
        }
        local_f8 = (Vec_Flt_t *)Vec_PtrEntry((Vec_Ptr_t *)vIndex1,(int)Entry + 2);
        local_100 = (Vec_Flt_t *)Vec_PtrEntry((Vec_Ptr_t *)vIndex1,(int)Entry + 3);
        pvVar7 = Vec_PtrEntry((Vec_Ptr_t *)vIndex1,(int)Entry + 1);
        if (pvVar7 == (void *)0x0) {
          if (vIndex2 != (Vec_Flt_t *)0x0) {
            iVar1 = Vec_FltSize(vIndex2);
            iVar2 = Vec_FltSize(local_f8);
            if (iVar1 != iVar2) {
              __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                            ,1099,
                            "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
          }
          if (vValues != (Vec_Flt_t *)0x0) {
            iVar1 = Vec_FltSize(vValues);
            iVar2 = Vec_FltSize(local_100);
            if (iVar1 != iVar2) {
              __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                            ,0x44c,
                            "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
          }
          pSVar5 = pTiming_local;
          local_c8 = local_f8;
          if (vIndex2 != (Vec_Flt_t *)0x0) {
            local_c8 = vIndex2;
          }
          local_d0 = local_100;
          if (vValues != (Vec_Flt_t *)0x0) {
            local_d0 = vValues;
          }
          pVVar8 = Vec_FltDup(local_c8);
          Vec_PtrPush((Vec_Ptr_t *)pSVar5,pVVar8);
          pSVar5 = pTiming_local;
          pVVar8 = Vec_FltDup(local_d0);
          Vec_PtrPush((Vec_Ptr_t *)pSVar5,pVVar8);
          pSVar5 = pTiming_local;
          pVVar8 = Vec_FltDup(vInd1);
          Vec_PtrPush((Vec_Ptr_t *)pSVar5,pVVar8);
        }
        else {
          iVar1 = Vec_FltSize(vInd1);
          pVVar8 = Vec_FltAlloc(iVar1);
          if (vValues != (Vec_Flt_t *)0x0) {
            iVar1 = Vec_FltSize(vValues);
            iVar2 = Vec_FltSize(local_f8);
            if (iVar1 != iVar2) {
              __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                            ,0x457,
                            "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
          }
          if (vIndex2 != (Vec_Flt_t *)0x0) {
            iVar1 = Vec_FltSize(vIndex2);
            iVar2 = Vec_FltSize(local_100);
            if (iVar1 != iVar2) {
              __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                            ,0x458,
                            "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
          }
          if (vValues != (Vec_Flt_t *)0x0) {
            local_f8 = vValues;
          }
          if (vIndex2 != (Vec_Flt_t *)0x0) {
            local_100 = vIndex2;
          }
          iVar1 = Vec_FltSize(local_f8);
          iVar2 = Vec_FltSize(local_100);
          iVar3 = Vec_FltSize(vInd1);
          if (iVar1 * iVar2 != iVar3) {
            __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                          ,0x45c,
                          "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          for (local_88 = 0.0; iVar1 = Vec_FltSize(vInd1), (int)local_88 < iVar1;
              local_88 = (float)((int)local_88 + 1)) {
            Vec_FltEntry(vInd1,(int)local_88);
            iVar1 = Vec_FltSize(local_100);
            iVar2 = Vec_FltSize(local_100);
            pVVar9 = vInd1;
            iVar3 = Vec_FltSize(local_f8);
            Entry_00 = Vec_FltEntry(pVVar9,((int)local_88 % iVar1) * iVar3 + (int)local_88 / iVar2);
            Vec_FltPush(pVVar8,Entry_00);
          }
          iVar1 = Vec_FltSize(vInd1);
          iVar2 = Vec_FltSize(pVVar8);
          pSVar5 = pTiming_local;
          if (iVar1 != iVar2) {
            __assert_fail("Vec_FltSize(vValues) == Vec_FltSize(vValues2)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                          ,0x464,
                          "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          pVVar9 = Vec_FltDup(local_f8);
          Vec_PtrPush((Vec_Ptr_t *)pSVar5,pVVar9);
          pSVar5 = pTiming_local;
          pVVar9 = Vec_FltDup(local_100);
          Vec_PtrPush((Vec_Ptr_t *)pSVar5,pVVar9);
          Vec_PtrPush((Vec_Ptr_t *)pTiming_local,pVVar8);
        }
        Vec_FltFreeP(&vIndex2);
        Vec_FltFreeP(&vValues);
        Vec_FltFreeP(&vInd1);
      }
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Scl_LibertyScanTable( Scl_Tree_t * p, Vec_Ptr_t * vOut, Scl_Item_t * pTiming, char * pName, Vec_Ptr_t * vTemples )
{
    Vec_Flt_t * vIndex1 = NULL;
    Vec_Flt_t * vIndex2 = NULL;
    Vec_Flt_t * vValues = NULL;
    Vec_Flt_t * vInd1, * vInd2;
    Scl_Item_t * pItem, * pTable = NULL;
    char * pThis, * pTempl = NULL;
    int iPlace, i;
    float Entry;
    // find the table
    Scl_ItemForEachChildName( p, pTiming, pTable, pName )
        break;
    if ( pTable == NULL )
        return 0;
    // find the template
    pTempl = Scl_LibertyReadString(p, pTable->Head);
    if ( pTempl == NULL || pTempl[0] == 0 )
    {
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        if ( vIndex1 == NULL || vIndex2 == NULL || vValues == NULL )
            { printf( "Incomplete table specification\n" ); return 0; }
        // dump the table
        vInd1 = vIndex1;
        vInd2 = vIndex2;
        // write entries
        Vec_PtrPush( vOut, vInd1 );
        Vec_PtrPush( vOut, vInd2 );
        Vec_PtrPush( vOut, vValues );
    }
    else if ( !strcmp(pTempl, "scalar") )
    {
        Scl_ItemForEachChild( p, pTable, pItem )
            if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
            {
                assert(vValues == NULL);
                vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
                assert( Vec_FltSize(vValues) == 1 );
                // write entries
                Vec_PtrPush( vOut, Vec_IntStart(1) );
                Vec_PtrPush( vOut, Vec_IntStart(1) );
                Vec_PtrPush( vOut, vValues );
                break;
            }
            else
            { printf( "Cannot read \"scalar\" template\n" ); return 0; }
    }
    else
    {
        // fetch the template
        iPlace = -1;
        Vec_PtrForEachEntry( char *, vTemples, pThis, i )
            if ( i % 4 == 0 && !strcmp(pTempl, pThis) )
            {  
                iPlace = i;
                break;
            }
        if ( iPlace == -1 )
            { printf( "Template cannot be found in the template library\n" ); return 0; }
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        // check the template style
        vInd1 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 2 ); // slew
        vInd2 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 3 ); // load
        if ( Vec_PtrEntry(vTemples, iPlace + 1) == NULL ) // normal order (vIndex1 is slew; vIndex2 is load)
        {
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1) );
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2) );
            vInd1 = vIndex1 ? vIndex1 : vInd1;
            vInd2 = vIndex2 ? vIndex2 : vInd2;
            // write entries
            Vec_PtrPush( vOut, Vec_FltDup(vInd1) );
            Vec_PtrPush( vOut, Vec_FltDup(vInd2) );
            Vec_PtrPush( vOut, Vec_FltDup(vValues) );
        }
        else  // reverse order (vIndex2 is slew; vIndex1 is load)
        {
            Vec_Flt_t * vValues2 = Vec_FltAlloc( Vec_FltSize(vValues) );
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1) );
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2) );
            vInd1 = vIndex2 ? vIndex2 : vInd1;
            vInd2 = vIndex1 ? vIndex1 : vInd2;
            // write entries -- transpose
            assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
            Vec_FltForEachEntry( vValues, Entry, i )
            {
                int x = i % Vec_FltSize(vInd2);
                int y = i / Vec_FltSize(vInd2);
                Entry = Vec_FltEntry( vValues, x * Vec_FltSize(vInd1) + y );
                Vec_FltPush( vValues2, Entry );
            }
            assert( Vec_FltSize(vValues) == Vec_FltSize(vValues2) );
            // write entries
            Vec_PtrPush( vOut, Vec_FltDup(vInd1) );
            Vec_PtrPush( vOut, Vec_FltDup(vInd2) );
            Vec_PtrPush( vOut, vValues2 );
        }
        Vec_FltFreeP( &vIndex1 );
        Vec_FltFreeP( &vIndex2 );
        Vec_FltFreeP( &vValues );
    }
    return 1;
}